

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  int iVar1;
  int local_3c;
  int local_38;
  int right_end;
  int left_end;
  int mode;
  int *p_right_local;
  int *p_left_local;
  int *len_local;
  vorb *f_local;
  
  _left_end = p_right;
  p_right_local = p_left;
  p_left_local = len;
  len_local = (int *)f;
  iVar1 = vorbis_decode_initial(f,p_left,&local_38,p_right,&local_3c,&right_end);
  if (iVar1 == 0) {
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ =
         vorbis_decode_packet_rest
                   ((vorb *)len_local,p_left_local,
                    (Mode *)((long)len_local + (long)right_end * 6 + 500),*p_right_local,local_38,
                    *_left_end,local_3c,p_right_local);
  }
  return f_local._4_4_;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}